

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,VarState>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VarState>>>
::
emplace_at<std::piecewise_construct_t_const&,std::tuple<unsigned_long&>,std::tuple<unsigned_short&&>>
          (raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,VarState>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VarState>>>
           *this,size_t i,piecewise_construct_t *args,tuple<unsigned_long_&> *args_1,
          tuple<unsigned_short_&&> *args_2)

{
  unsigned_short uVar1;
  long lVar2;
  unsigned_short *puVar3;
  key_arg<unsigned_long> *key;
  undefined1 auVar4 [16];
  unsigned_long *puVar5;
  iterator iVar6;
  
  lVar2 = *(long *)(this + 8);
  puVar5 = (unsigned_long *)operator_new(0x28);
  puVar3 = (args_2->super__Tuple_impl<0UL,_unsigned_short_&&>).
           super__Head_base<0UL,_unsigned_short_&&,_false>._M_head_impl;
  *puVar5 = *(args_1->super__Tuple_impl<0UL,_unsigned_long_&>).
             super__Head_base<0UL,_unsigned_long_&,_false>._M_head_impl;
  uVar1 = *puVar3;
  puVar5[1] = 0;
  puVar5[2] = 0;
  *(undefined8 *)((long)puVar5 + 0x11) = 0;
  *(undefined8 *)((long)puVar5 + 0x19) = 0;
  *(unsigned_short *)((long)puVar5 + 0x22) = uVar1;
  *(unsigned_long **)(lVar2 + i * 8) = puVar5;
  key = *(key_arg<unsigned_long> **)(*(long *)(this + 8) + i * 8);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *key;
  iVar6 = raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
          ::find<unsigned_long>
                    ((raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
                      *)this,key,
                     SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar4,8) +
                     SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar4,0));
  if (iVar6.ctrl_ == (ctrl_t *)(i + *(long *)this)) {
    return;
  }
  __assert_fail("PolicyTraits::apply(FindElement{*this}, *iterator_at(i)) == iterator_at(i) && \"constructed value does not match the lookup key\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x802,
                "void phmap::container_internal::raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned long, VarState>, phmap::Hash<uint64_t>, phmap::EqualTo<unsigned long>, std::allocator<std::pair<const unsigned long, VarState>>>::emplace_at(size_t, Args &&...) [Policy = phmap::container_internal::NodeHashMapPolicy<unsigned long, VarState>, Hash = phmap::Hash<uint64_t>, Eq = phmap::EqualTo<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, VarState>>, Args = <const std::piecewise_construct_t &, std::tuple<unsigned long &>, std::tuple<unsigned short &&>>]"
               );
}

Assistant:

void emplace_at(size_t i, Args&&... args) {
        PolicyTraits::construct(&alloc_ref(), slots_ + i,
                                std::forward<Args>(args)...);

        assert(PolicyTraits::apply(FindElement{*this}, *iterator_at(i)) ==
               iterator_at(i) &&
               "constructed value does not match the lookup key");
    }